

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

SymOpnd * __thiscall
IRBuilder::BuildFieldOpnd
          (IRBuilder *this,OpCode newOpcode,RegSlot reg,PropertyId propertyId,
          PropertyIdIndexType propertyIdIndex,PropertyKind propertyKind,uint inlineCacheIndex)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar4;
  PropertySym *propertySym;
  PropertySymOpnd *pPVar5;
  SymOpnd *pSVar6;
  
  this_00 = Func::GetJITFunctionBody(this->m_func);
  uVar3 = JITTimeFunctionBody::GetInlineCacheCount(this_00);
  if ((inlineCacheIndex != 0xffffffff) && (uVar3 <= inlineCacheIndex)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x491,
                       "(inlineCacheIndex < m_func->GetJITFunctionBody()->GetInlineCacheCount() || inlineCacheIndex == Js::Constants::NoInlineCacheIndex)"
                       ,
                       "inlineCacheIndex < m_func->GetJITFunctionBody()->GetInlineCacheCount() || inlineCacheIndex == Js::Constants::NoInlineCacheIndex"
                      );
    if (!bVar2) goto LAB_0048a164;
    *puVar4 = 0;
  }
  propertySym = BuildFieldSym(this,reg,propertyId,propertyIdIndex,inlineCacheIndex,propertyKind);
  bVar2 = OpCodeAttr::FastFldInstr(newOpcode);
  if (inlineCacheIndex == 0xffffffff && !bVar2) {
    pSVar6 = IR::SymOpnd::New(&propertySym->super_Sym,TyVar,this->m_func);
    return pSVar6;
  }
  if (propertyKind != PropertyKindData) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x499,"(propertyKind == PropertyKindData)",
                       "propertyKind == PropertyKindData");
    if (!bVar2) {
LAB_0048a164:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pPVar5 = IR::PropertySymOpnd::New(propertySym,inlineCacheIndex,TyVar,this->m_func);
  if ((inlineCacheIndex != 0xffffffff) && (propertySym->m_loadInlineCacheIndex == 0xffffffff)) {
    bVar2 = GlobOpt::IsPREInstrCandidateLoad(newOpcode);
    if (bVar2) {
      propertySym->m_loadInlineCacheIndex = inlineCacheIndex;
      propertySym->m_loadInlineCacheFunc = this->m_func;
    }
  }
  return &pPVar5->super_SymOpnd;
}

Assistant:

IR::SymOpnd *
IRBuilder::BuildFieldOpnd(Js::OpCode newOpcode, Js::RegSlot reg, Js::PropertyId propertyId, Js::PropertyIdIndexType propertyIdIndex, PropertyKind propertyKind, uint inlineCacheIndex)
{
    AssertOrFailFast(inlineCacheIndex < m_func->GetJITFunctionBody()->GetInlineCacheCount() || inlineCacheIndex == Js::Constants::NoInlineCacheIndex);
    PropertySym * propertySym = BuildFieldSym(reg, propertyId, propertyIdIndex, inlineCacheIndex, propertyKind);
    IR::SymOpnd * symOpnd;

    // If we plan to apply object type optimization to this instruction or if we intend to emit a fast path using an inline
    // cache, we will need a property sym operand.
    if (OpCodeAttr::FastFldInstr(newOpcode) || inlineCacheIndex != (uint)-1)
    {
        Assert(propertyKind == PropertyKindData);
        symOpnd = IR::PropertySymOpnd::New(propertySym, inlineCacheIndex, TyVar, this->m_func);

        if (inlineCacheIndex != (uint)-1 && propertySym->m_loadInlineCacheIndex == (uint)-1)
        {
            if (GlobOpt::IsPREInstrCandidateLoad(newOpcode))
            {
                propertySym->m_loadInlineCacheIndex = inlineCacheIndex;
                propertySym->m_loadInlineCacheFunc = this->m_func;
            }
        }
    }
    else
    {
        symOpnd = IR::SymOpnd::New(propertySym, TyVar, this->m_func);
    }

    return symOpnd;
}